

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qjsonobject.cpp
# Opt level: O3

QJsonValue * __thiscall
QJsonObject::takeImpl<QLatin1String>
          (QJsonValue *__return_storage_ptr__,QJsonObject *this,QLatin1String key)

{
  qsizetype index;
  QJsonValue *result;
  long in_FS_OFFSET;
  bool keyExists;
  bool local_41;
  QCborValue local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->o).d.ptr != (QCborContainerPrivate *)0x0) {
    local_41 = true;
    index = indexOf<QLatin1String>(&this->o,key,&local_41);
    if (local_41 != false) {
      detach(this,0);
      (__return_storage_ptr__->value).n = (qint64)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->value).container = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      *(undefined1 **)&(__return_storage_ptr__->value).t = &DAT_aaaaaaaaaaaaaaaa;
      QCborContainerPrivate::extractAt(&local_40,(this->o).d.ptr,index + 1);
      *(undefined1 **)&(__return_storage_ptr__->value).t = &DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->value).n = (qint64)&DAT_aaaaaaaaaaaaaaaa;
      (__return_storage_ptr__->value).container = (QCborContainerPrivate *)&DAT_aaaaaaaaaaaaaaaa;
      QJsonValue::QJsonValue(__return_storage_ptr__,Null);
      QCborValue::operator=((QCborValue *)__return_storage_ptr__,&local_40);
      QCborValue::~QCborValue((QCborValue *)&local_40);
      removeAt(this,index);
      if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
        return __return_storage_ptr__;
      }
      goto LAB_002f1d58;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    QJsonValue::QJsonValue(__return_storage_ptr__,Undefined);
    return __return_storage_ptr__;
  }
LAB_002f1d58:
  __stack_chk_fail();
}

Assistant:

QJsonValue QJsonObject::takeImpl(T key)
{
    if (!o)
        return QJsonValue(QJsonValue::Undefined);

    bool keyExists;
    auto index = indexOf(o, key, &keyExists);
    if (!keyExists)
        return QJsonValue(QJsonValue::Undefined);

    detach();
    const QJsonValue v = QJsonPrivate::Value::fromTrustedCbor(o->extractAt(index + 1));
    removeAt(index);
    return v;
}